

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O2

uint32_t __thiscall wabt::Opcode::GetSimdLaneCount(Opcode *this)

{
  uint32_t uVar1;
  
  switch(this->enum_) {
  case I8X16ExtractLaneS:
  case I8X16ExtractLaneU:
  case I8X16ReplaceLane:
switchD_001340ec_caseD_f3:
    return 0x10;
  case I16X8ExtractLaneS:
  case I16X8ExtractLaneU:
  case I16X8ReplaceLane:
switchD_001340ec_caseD_f6:
    uVar1 = 8;
    break;
  case I32X4ExtractLane:
  case I32X4ReplaceLane:
  case F32X4ExtractLane:
  case F32X4ReplaceLane:
switchD_001340ec_caseD_f9:
    uVar1 = 4;
    break;
  case I64X2ExtractLane:
  case I64X2ReplaceLane:
  case F64X2ExtractLane:
  case F64X2ReplaceLane:
LAB_00134114:
    return 2;
  default:
    switch(this->enum_) {
    case V128Load8Lane:
    case V128Store8Lane:
      goto switchD_001340ec_caseD_f3;
    case V128Load16Lane:
    case V128Store16Lane:
      goto switchD_001340ec_caseD_f6;
    case V128Load32Lane:
    case V128Store32Lane:
      goto switchD_001340ec_caseD_f9;
    case V128Load64Lane:
    case V128Store64Lane:
      goto LAB_00134114;
    default:
      abort();
    }
  }
  return uVar1;
}

Assistant:

uint32_t Opcode::GetSimdLaneCount() const {
  switch (enum_) {
    case Opcode::I8X16ExtractLaneS:
    case Opcode::I8X16ExtractLaneU:
    case Opcode::I8X16ReplaceLane:
    case Opcode::V128Load8Lane:
    case Opcode::V128Store8Lane:
      return 16;
      break;
    case Opcode::I16X8ExtractLaneS:
    case Opcode::I16X8ExtractLaneU:
    case Opcode::I16X8ReplaceLane:
    case Opcode::V128Load16Lane:
    case Opcode::V128Store16Lane:
      return 8;
      break;
    case Opcode::F32X4ExtractLane:
    case Opcode::F32X4ReplaceLane:
    case Opcode::I32X4ExtractLane:
    case Opcode::I32X4ReplaceLane:
    case Opcode::V128Load32Lane:
    case Opcode::V128Store32Lane:
      return 4;
      break;
    case Opcode::F64X2ExtractLane:
    case Opcode::F64X2ReplaceLane:
    case Opcode::I64X2ExtractLane:
    case Opcode::I64X2ReplaceLane:
    case Opcode::V128Load64Lane:
    case Opcode::V128Store64Lane:
      return 2;
      break;
    default:
      WABT_UNREACHABLE;
  }
}